

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# txmempool.cpp
# Opt level: O1

void __thiscall
CTxMemPool::addUnchecked(CTxMemPool *this,CTxMemPoolEntry *entry,setEntries *setAncestors)

{
  pointer *ppCVar1;
  size_type *psVar2;
  CTransaction *pCVar3;
  long lVar4;
  bool bVar5;
  txiter entry_00;
  const_iterator cVar6;
  int64_t iVar7;
  ulong uVar8;
  ulong uVar9;
  CAmount fee_diff;
  long in_FS_OFFSET;
  pair<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>_*,_bool>
  pVar10;
  set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
  setParentTransactions;
  undefined1 local_98 [8];
  _Rb_tree_node_base local_90;
  _Rb_tree<transaction_identifier<false>,_transaction_identifier<false>,_std::_Identity<transaction_identifier<false>_>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
  local_68;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pVar10 = boost::multi_index::
           multi_index_container<CTxMemPoolEntry,CTxMemPool::CTxMemPoolEntry_Indices,std::allocator<CTxMemPoolEntry>>
           ::emplace_<CTxMemPoolEntry::ExplicitCopyTag_const&,CTxMemPoolEntry_const&>
                     ((multi_index_container<CTxMemPoolEntry,CTxMemPool::CTxMemPoolEntry_Indices,std::allocator<CTxMemPoolEntry>>
                       *)&this->mapTx,(ExplicitCopyTag *)&CTxMemPoolEntry::ExplicitCopy,entry);
  entry_00.node = pVar10.first;
  cVar6 = std::
          _Rb_tree<uint256,_std::pair<const_uint256,_long>,_std::_Select1st<std::pair<const_uint256,_long>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_long>_>_>
          ::find(&(this->mapDeltas)._M_t,
                 &(((entry->tx).super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr)->hash).m_wrapped);
  if ((_Rb_tree_header *)cVar6._M_node == &(this->mapDeltas)._M_t._M_impl.super__Rb_tree_header) {
    fee_diff = 0;
  }
  else {
    fee_diff = *(CAmount *)(cVar6._M_node + 2);
  }
  if (fee_diff != 0) {
    CTxMemPoolEntry::UpdateModifiedFee((CTxMemPoolEntry *)entry_00.node,fee_diff);
    bVar5 = boost::multi_index::detail::
            hashed_index<mempoolentry_txid,_SaltedTxidHasher,_std::equal_to<uint256>,_boost::multi_index::detail::nth_layer<1,_CTxMemPoolEntry,_CTxMemPool::CTxMemPoolEntry_Indices,_std::allocator<CTxMemPoolEntry>_>,_boost::mpl::vector0<mpl_::na>,_boost::multi_index::detail::hashed_unique_tag>
            ::modify_(&(this->mapTx).super_type,entry_00.node);
    if (!bVar5) {
      std::
      allocator_traits<std::allocator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>_>_>
      ::destroy<CTxMemPoolEntry>((allocator_type *)&this->mapTx,(CTxMemPoolEntry *)entry_00.node);
      operator_delete(entry_00.node,0x178);
      psVar2 = &(this->mapTx).node_count;
      *psVar2 = *psVar2 - 1;
    }
  }
  this->cachedInnerUsage = this->cachedInnerUsage + entry->nUsageSize;
  pCVar3 = *(CTransaction **)
            &((entry_00.node)->
             super_hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>
             ).
             super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>
             .
             super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>
             .
             super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>
             .super_index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>.
             super_pod_value_holder<CTxMemPoolEntry>.space;
  local_68._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_68._M_impl.super__Rb_tree_header._M_header;
  local_68._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_68._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_68._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_68._M_impl.super__Rb_tree_header._M_header._M_right =
       local_68._M_impl.super__Rb_tree_header._M_header._M_left;
  if ((pCVar3->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      (pCVar3->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
      super__Vector_impl_data._M_start) {
    uVar8 = 0;
    uVar9 = 1;
    do {
      local_98 = (undefined1  [8])
                 ((pCVar3->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                  super__Vector_impl_data._M_start + uVar8);
      local_90._0_8_ = pCVar3;
      std::
      _Rb_tree<COutPoint_const*,std::pair<COutPoint_const*const,CTransaction_const*>,std::_Select1st<std::pair<COutPoint_const*const,CTransaction_const*>>,DereferencingComparator<COutPoint_const*>,std::allocator<std::pair<COutPoint_const*const,CTransaction_const*>>>
      ::_M_insert_unique<std::pair<COutPoint_const*const,CTransaction_const*>const&>
                ((_Rb_tree<COutPoint_const*,std::pair<COutPoint_const*const,CTransaction_const*>,std::_Select1st<std::pair<COutPoint_const*const,CTransaction_const*>>,DereferencingComparator<COutPoint_const*>,std::allocator<std::pair<COutPoint_const*const,CTransaction_const*>>>
                  *)&this->mapNextTx,(pair<const_COutPoint_*const,_const_CTransaction_*> *)local_98)
      ;
      std::
      _Rb_tree<transaction_identifier<false>,transaction_identifier<false>,std::_Identity<transaction_identifier<false>>,std::less<transaction_identifier<false>>,std::allocator<transaction_identifier<false>>>
      ::_M_insert_unique<transaction_identifier<false>const&>
                ((_Rb_tree<transaction_identifier<false>,transaction_identifier<false>,std::_Identity<transaction_identifier<false>>,std::less<transaction_identifier<false>>,std::allocator<transaction_identifier<false>>>
                  *)&local_68,
                 (transaction_identifier<false> *)
                 ((pCVar3->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                  super__Vector_impl_data._M_start + uVar8));
      uVar8 = ((long)(pCVar3->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)(pCVar3->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                     super__Vector_impl_data._M_start >> 3) * 0x4ec4ec4ec4ec4ec5;
      bVar5 = uVar9 <= uVar8;
      lVar4 = uVar8 - uVar9;
      uVar8 = uVar9;
      uVar9 = (ulong)((int)uVar9 + 1);
    } while (bVar5 && lVar4 != 0);
  }
  GetIterSet((setEntries *)local_98,this,
             (set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
              *)&local_68);
  for (; local_90._M_left != &local_90;
      local_90._M_left = (_Base_ptr)std::_Rb_tree_increment(local_90._M_left)) {
    UpdateParent(this,entry_00,
                 *(hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>
                   **)(local_90._M_left + 1),true);
  }
  std::_Rb_tree<$270907ca$>::~_Rb_tree((_Rb_tree<_270907ca_> *)local_98);
  UpdateAncestorsOf(this,true,entry_00,setAncestors);
  UpdateEntryForAncestors(this,entry_00,setAncestors);
  LOCK();
  (this->nTransactionsUpdated).super___atomic_base<unsigned_int>._M_i =
       (this->nTransactionsUpdated).super___atomic_base<unsigned_int>._M_i + 1;
  UNLOCK();
  iVar7 = GetVirtualTransactionSize((long)entry->nTxWeight,entry->sigOpCost,nBytesPerSigOp);
  this->totalTxSize = this->totalTxSize + (long)(int)iVar7;
  this->m_total_fee = this->m_total_fee + entry->nFee;
  local_98 = *(undefined1 (*) [8])
              &((entry_00.node)->
               super_hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>
               ).
               super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>
               .
               super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>
               .
               super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>
               .super_index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>.
               super_pod_value_holder<CTxMemPoolEntry>.space;
  local_90._0_8_ =
       *(long *)((long)&((entry_00.node)->
                        super_hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>
                        ).
                        super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>
                        .
                        super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>
                        .
                        super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>
                        .super_index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>.
                        super_pod_value_holder<CTxMemPoolEntry>.space + 8);
  if ((CTransaction *)local_90._0_8_ != (CTransaction *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      ppCVar1 = &(((CTransaction *)local_90._0_8_)->vin).
                 super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
                 _M_finish;
      *(int *)ppCVar1 = *(int *)ppCVar1 + 1;
      UNLOCK();
    }
    else {
      ppCVar1 = &(((CTransaction *)local_90._0_8_)->vin).
                 super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
                 _M_finish;
      *(int *)ppCVar1 = *(int *)ppCVar1 + 1;
    }
  }
  std::
  vector<std::shared_ptr<CTransaction_const>,std::allocator<std::shared_ptr<CTransaction_const>>>::
  emplace_back<std::shared_ptr<CTransaction_const>>
            ((vector<std::shared_ptr<CTransaction_const>,std::allocator<std::shared_ptr<CTransaction_const>>>
              *)&this->txns_randomized,(shared_ptr<const_CTransaction> *)local_98);
  if ((CTransaction *)local_90._0_8_ != (CTransaction *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_90._0_8_);
  }
  *(long *)((long)&((entry_00.node)->
                   super_hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>
                   ).
                   super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>
                   .
                   super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>
                   .
                   super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>
                   .super_index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>.
                   super_pod_value_holder<CTxMemPoolEntry>.space + 0x100) =
       ((long)(this->txns_randomized).
              super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)(this->txns_randomized).
              super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
              ._M_impl.super__Vector_impl_data._M_start >> 4) + -1;
  std::
  _Rb_tree<transaction_identifier<false>,_transaction_identifier<false>,_std::_Identity<transaction_identifier<false>_>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
  ::~_Rb_tree(&local_68);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void CTxMemPool::addUnchecked(const CTxMemPoolEntry &entry, setEntries &setAncestors)
{
    // Add to memory pool without checking anything.
    // Used by AcceptToMemoryPool(), which DOES do
    // all the appropriate checks.
    indexed_transaction_set::iterator newit = mapTx.emplace(CTxMemPoolEntry::ExplicitCopy, entry).first;

    // Update transaction for any feeDelta created by PrioritiseTransaction
    CAmount delta{0};
    ApplyDelta(entry.GetTx().GetHash(), delta);
    // The following call to UpdateModifiedFee assumes no previous fee modifications
    Assume(entry.GetFee() == entry.GetModifiedFee());
    if (delta) {
        mapTx.modify(newit, [&delta](CTxMemPoolEntry& e) { e.UpdateModifiedFee(delta); });
    }

    // Update cachedInnerUsage to include contained transaction's usage.
    // (When we update the entry for in-mempool parents, memory usage will be
    // further updated.)
    cachedInnerUsage += entry.DynamicMemoryUsage();

    const CTransaction& tx = newit->GetTx();
    std::set<Txid> setParentTransactions;
    for (unsigned int i = 0; i < tx.vin.size(); i++) {
        mapNextTx.insert(std::make_pair(&tx.vin[i].prevout, &tx));
        setParentTransactions.insert(tx.vin[i].prevout.hash);
    }
    // Don't bother worrying about child transactions of this one.
    // Normal case of a new transaction arriving is that there can't be any
    // children, because such children would be orphans.
    // An exception to that is if a transaction enters that used to be in a block.
    // In that case, our disconnect block logic will call UpdateTransactionsFromBlock
    // to clean up the mess we're leaving here.

    // Update ancestors with information about this tx
    for (const auto& pit : GetIterSet(setParentTransactions)) {
            UpdateParent(newit, pit, true);
    }
    UpdateAncestorsOf(true, newit, setAncestors);
    UpdateEntryForAncestors(newit, setAncestors);

    nTransactionsUpdated++;
    totalTxSize += entry.GetTxSize();
    m_total_fee += entry.GetFee();

    txns_randomized.emplace_back(newit->GetSharedTx());
    newit->idx_randomized = txns_randomized.size() - 1;

    TRACE3(mempool, added,
        entry.GetTx().GetHash().data(),
        entry.GetTxSize(),
        entry.GetFee()
    );
}